

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage2DDepthCase::createTexture(TexSubImage2DDepthCase *this)

{
  deUint32 dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int height;
  TransferFormat TVar5;
  char *str;
  void *pvVar6;
  PixelBufferAccess local_188;
  PixelBufferAccess local_160;
  int local_138;
  undefined1 local_134 [4];
  int cellSize;
  Vec4 colorB;
  Vec4 colorA;
  int y;
  int x;
  int h;
  int w;
  int levelH_1;
  int levelW_1;
  int ndx_1;
  PixelBufferAccess local_d0;
  undefined1 local_a8 [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelH;
  int levelW;
  int ndx;
  TextureFormat local_70;
  undefined1 local_68 [8];
  TextureLevel levelData;
  undefined1 local_38 [4];
  deUint32 tex;
  Random rnd;
  deUint32 local_20;
  deUint32 dStack_1c;
  TransferFormat fmt;
  TexSubImage2DDepthCase *this_local;
  
  rnd.m_rnd._8_8_ = (this->super_Texture2DSpecCase).m_texFormat;
  TVar5 = glu::getTransferFormat((TextureFormat)rnd.m_rnd._8_8_);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_38,dVar1);
  levelData.m_data.m_cap._4_4_ = 0;
  local_20 = TVar5.format;
  dStack_1c = TVar5.dataType;
  local_70 = glu::mapGLTransferFormat(local_20,dStack_1c);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_68,&local_70);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  dVar1 = sglr::ContextWrapper::glGetError
                    (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper);
  glu::checkError(dVar1,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
                  ,0xc3d);
  for (levelH = 0; levelH < (this->super_Texture2DSpecCase).m_numLevels; levelH = levelH + 1) {
    iVar2 = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH & 0x1f));
    iVar3 = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-1.5,-2.0,1.7,-1.5);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_a8,2.0,1.5,-1.0,2.0);
    tcu::TextureLevel::setSize((TextureLevel *)local_68,iVar2,iVar3,1);
    tcu::TextureLevel::getAccess(&local_d0,(TextureLevel *)local_68);
    tcu::fillWithComponentGradients(&local_d0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_a8);
    iVar4 = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&levelW_1,(TextureLevel *)local_68);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&levelW_1);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               levelH,iVar4,iVar2,iVar3,0,local_20,dStack_1c,pvVar6);
  }
  for (levelH_1 = 0; levelH_1 < (this->super_Texture2DSpecCase).m_numLevels; levelH_1 = levelH_1 + 1
      ) {
    iVar4 = de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH_1 & 0x1f));
    iVar2 = de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH_1 & 0x1f));
    iVar3 = de::Random::getInt((Random *)local_38,1,iVar4);
    height = de::Random::getInt((Random *)local_38,1,iVar2);
    iVar4 = de::Random::getInt((Random *)local_38,0,iVar4 - iVar3);
    iVar2 = de::Random::getInt((Random *)local_38,0,iVar2 - height);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),2.0,1.5,-1.0,2.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_134,-1.5,-2.0,1.7,-1.5);
    local_138 = de::Random::getInt((Random *)local_38,2,0x10);
    tcu::TextureLevel::setSize((TextureLevel *)local_68,iVar3,height,1);
    tcu::TextureLevel::getAccess(&local_160,(TextureLevel *)local_68);
    tcu::fillWithGrid(&local_160,local_138,(Vec4 *)(colorB.m_data + 2),(Vec4 *)local_134);
    tcu::TextureLevel::getAccess(&local_188,(TextureLevel *)local_68);
    pvVar6 = tcu::PixelBufferAccess::getDataPtr(&local_188);
    sglr::ContextWrapper::glTexSubImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               levelH_1,iVar4,iVar2,iVar3,height,local_20,dStack_1c,pvVar6);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_68);
  de::Random::~Random((Random *)local_38);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat	fmt			= glu::getTransferFormat(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(fmt.format, fmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		GLU_CHECK();

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int   levelW		= de::max(1, m_width >> ndx);
			const int   levelH		= de::max(1, m_height >> ndx);
			const Vec4  gMin		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const Vec4  gMax		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			const int	levelW		= de::max(1, m_width >> ndx);
			const int	levelH		= de::max(1, m_height >> ndx);

			const int	w			= rnd.getInt(1, levelW);
			const int	h			= rnd.getInt(1, levelH);
			const int	x			= rnd.getInt(0, levelW-w);
			const int	y			= rnd.getInt(0, levelH-h);

			const Vec4	colorA		= Vec4(2.0f, 1.5f, -1.0f, 2.0f);
			const Vec4	colorB		= Vec4(-1.5f, -2.0f, 1.7f, -1.5f);
			const int	cellSize	= rnd.getInt(2, 16);

			levelData.setSize(w, h);
			tcu::fillWithGrid(levelData.getAccess(), cellSize, colorA, colorB);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, x, y, w, h, fmt.format, fmt.dataType, levelData.getAccess().getDataPtr());
		}
	}